

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O1

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::save_data
          (section_impl<ELFIO::Elf64_Shdr> *this,ostream *stream,streampos data_offset)

{
  element_type *peVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer *__ptr;
  unique_ptr<char[],_std::default_delete<char[]>_> compressed_ptr;
  Elf_Xword compressed_size;
  void *local_28;
  undefined8 local_20;
  
  adjust_stream_size(stream,data_offset._M_off);
  uVar2 = (*(this->super_section)._vptr_section[7])(this);
  if ((uVar2 >> 0xb & 1) == 0) {
    uVar2 = (*(this->super_section)._vptr_section[7])(this);
    if ((uVar2 >> 0x1b & 1) == 0) goto LAB_00105915;
  }
  if ((this->compression).
      super___shared_ptr<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar3 = (*(this->super_section)._vptr_section[0x13])(this);
    local_20 = 0;
    peVar1 = (this->compression).
             super___shared_ptr<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(code **)(*(long *)peVar1 + 0x18))
              (&local_28,peVar1,
               (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,this->convertor,iVar3,&local_20);
    std::ostream::write((char *)stream,(long)local_28);
    if (local_28 != (void *)0x0) {
      operator_delete__(local_28);
    }
    return;
  }
LAB_00105915:
  iVar3 = (*(this->super_section)._vptr_section[0x18])(this);
  (*(this->super_section)._vptr_section[0x13])(this);
  std::ostream::write((char *)stream,CONCAT44(extraout_var,iVar3));
  return;
}

Assistant:

void save_data( std::ostream& stream, std::streampos data_offset )
    {
        adjust_stream_size( stream, data_offset );

        if ( ( ( get_flags() & SHF_COMPRESSED ) ||
               ( get_flags() & SHF_RPX_DEFLATE ) ) &&
             compression != nullptr ) {
            Elf_Xword decompressed_size = get_size();
            Elf_Xword compressed_size   = 0;
            auto      compressed_ptr    = compression->deflate(
                data.get(), convertor, decompressed_size, compressed_size );
            stream.write( compressed_ptr.get(), compressed_size );
        }
        else {
            stream.write( get_data(), get_size() );
        }
    }